

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.c
# Opt level: O1

int lws_frag_start(lws *wsi,int hdr_token_idx)

{
  uint16_t *puVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  allocated_headers *paVar5;
  ulong uVar6;
  lws_fragments *plVar7;
  lws *wsi_00;
  int iVar8;
  byte bVar9;
  
  paVar5 = (wsi->http).ah;
  if (paVar5 == (allocated_headers *)0x0) {
    _lws_log(4,"%s: no ah\n","lws_frag_start");
    iVar8 = 1;
  }
  else {
    uVar6 = (ulong)(uint)hdr_token_idx;
    paVar5->hdr_token_idx = -1;
    _lws_log(0x40,"%s: token %d ah->pos = %d, ah->nfrag = %d\n","lws_frag_start",uVar6,
             (ulong)paVar5->pos,(ulong)paVar5->nfrag);
    if (hdr_token_idx == 0) {
      iVar8 = 1;
      _lws_log(1,"%s: zero hdr_token_idx\n","lws_frag_start");
    }
    else if (paVar5->nfrag < 0x5f) {
      if ((((hdr_token_idx - 0x23U < 4) || (hdr_token_idx == 0x55)) &&
          ((ulong)paVar5->frag_index[uVar6] != 0)) &&
         ((paVar5->frags[paVar5->frag_index[uVar6]].flags & 1) == 0)) {
        wsi_00 = lws_get_network_wsi(wsi);
        lws_h2_goaway(wsi_00,1,"Duplicated pseudoheader");
        iVar8 = 1;
      }
      else {
        if (paVar5->nfrag == 0) {
          paVar5->nfrag = '\x01';
        }
        uVar4 = paVar5->pos;
        bVar2 = paVar5->nfrag;
        paVar5->frags[bVar2].offset = uVar4;
        plVar7 = paVar5->frags + bVar2;
        plVar7->len = 0;
        plVar7->nfrag = '\0';
        plVar7->flags = '\x02';
        paVar5->hdr_token_idx = hdr_token_idx;
        bVar3 = paVar5->frag_index[uVar6];
        if (paVar5->frag_index[uVar6] == 0) {
          paVar5->frag_index[uVar6] = bVar2;
          iVar8 = 0;
        }
        else {
          do {
            bVar9 = bVar3;
            bVar3 = paVar5->frags[bVar9].nfrag;
          } while (bVar3 != 0);
          paVar5->frags[bVar9].nfrag = bVar2;
          iVar8 = 0;
          if (hdr_token_idx == 0x1a) {
            paVar5->pos = uVar4 + 1;
            paVar5->data[uVar4] = ';';
            puVar1 = &paVar5->frags[paVar5->nfrag].len;
            *puVar1 = *puVar1 + 1;
            iVar8 = 0;
          }
        }
      }
    }
    else {
      _lws_log(1,"%s: frag index %d too big\n","lws_frag_start");
      iVar8 = 1;
    }
  }
  return iVar8;
}

Assistant:

static int lws_frag_start(struct lws *wsi, int hdr_token_idx)
{
	struct allocated_headers *ah = wsi->http.ah;

	if (!ah) {
		lwsl_notice("%s: no ah\n", __func__);
		return 1;
	}

	ah->hdr_token_idx = -1;

	lwsl_header("%s: token %d ah->pos = %d, ah->nfrag = %d\n",
		   __func__, hdr_token_idx, ah->pos, ah->nfrag);

	if (!hdr_token_idx) {
		lwsl_err("%s: zero hdr_token_idx\n", __func__);
		return 1;
	}

	if (ah->nfrag >= LWS_ARRAY_SIZE(ah->frag_index)) {
		lwsl_err("%s: frag index %d too big\n", __func__, ah->nfrag);
		return 1;
	}

	if ((hdr_token_idx == WSI_TOKEN_HTTP_COLON_AUTHORITY ||
	     hdr_token_idx == WSI_TOKEN_HTTP_COLON_METHOD ||
	     hdr_token_idx == WSI_TOKEN_HTTP_COLON_PATH ||
	     hdr_token_idx == WSI_TOKEN_COLON_PROTOCOL ||
	     hdr_token_idx == WSI_TOKEN_HTTP_COLON_SCHEME) &&
	     ah->frag_index[hdr_token_idx]) {
		if (!(ah->frags[ah->frag_index[hdr_token_idx]].flags & 1)) {
			lws_h2_goaway(lws_get_network_wsi(wsi),
				      H2_ERR_PROTOCOL_ERROR,
				      "Duplicated pseudoheader");
			return 1;
		}
	}

	if (ah->nfrag == 0)
		ah->nfrag = 1;

	ah->frags[ah->nfrag].offset = ah->pos;
	ah->frags[ah->nfrag].len = 0;
	ah->frags[ah->nfrag].nfrag = 0;
	ah->frags[ah->nfrag].flags = 2; /* we had reason to set it */

	ah->hdr_token_idx = hdr_token_idx;

	/*
	 * Okay, but we could be, eg, the second or subsequent cookie: header
	 */

	if (ah->frag_index[hdr_token_idx]) {
		int n;

		/* find the last fragment for this header... */
		n = ah->frag_index[hdr_token_idx];
		while (ah->frags[n].nfrag)
			n = ah->frags[n].nfrag;
		/* and point it to continue in our continuation fragment */
		ah->frags[n].nfrag = ah->nfrag;

		/* cookie continuations need a separator token of ';' */
		if (hdr_token_idx == WSI_TOKEN_HTTP_COOKIE) {
			ah->data[ah->pos++] = ';';
			ah->frags[ah->nfrag].len++;
		}
	} else
		ah->frag_index[hdr_token_idx] = ah->nfrag;

	return 0;
}